

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

void If_Dec7ComposeLut4(int t,word (*f) [2],word *r)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  word *pwVar7;
  ulong uVar8;
  ulong uVar9;
  
  *r = 0;
  r[1] = 0;
  uVar1 = 0;
  uVar2 = 0;
  uVar4 = 0;
  do {
    if (((uint)t >> (uVar4 & 0x1f) & 1) != 0) {
      uVar5 = 0xffffffffffffffff;
      lVar3 = 0;
      uVar6 = 0xffffffffffffffff;
      pwVar7 = *f + 1;
      do {
        uVar8 = (*(word (*) [2])(pwVar7 + -1))[0];
        if ((uVar4 >> ((uint)lVar3 & 0x1f) & 1) == 0) {
          uVar8 = ~uVar8;
          uVar9 = ~*pwVar7;
        }
        else {
          uVar9 = *pwVar7;
        }
        uVar6 = uVar6 & uVar9;
        uVar5 = uVar5 & uVar8;
        lVar3 = lVar3 + 1;
        pwVar7 = pwVar7 + 2;
      } while (lVar3 != 4);
      uVar2 = uVar2 | uVar5;
      *r = uVar2;
      uVar1 = uVar1 | uVar6;
      r[1] = uVar1;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x10);
  return;
}

Assistant:

static void If_Dec7ComposeLut4( int t, word f[4][2], word r[2] )
{
    int m, v;
    word c[2];
    r[0] = r[1] = 0;
    for ( m = 0; m < 16; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c[0] = c[1] = ~(word)0;
        for ( v = 0; v < 4; v++ )
        {
            c[0] &= ((m >> v) & 1) ? f[v][0] : ~f[v][0];
            c[1] &= ((m >> v) & 1) ? f[v][1] : ~f[v][1];
        }
        r[0] |= c[0];
        r[1] |= c[1];
    }
}